

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookie.c
# Opt level: O0

int replace_existing(Curl_easy *data,Cookie *co,CookieInfo *ci,_Bool secure,_Bool *replacep)

{
  _Bool _Var1;
  int iVar2;
  size_t sVar3;
  void *pvVar4;
  char *pcVar5;
  Cookie *co_00;
  bool bVar6;
  Cookie *repl;
  char *sep;
  size_t cllen;
  _Bool matching_domains;
  Cookie *clist;
  size_t myhash;
  Curl_llist_node *n;
  Curl_llist_node *replace_n;
  _Bool replace_old;
  _Bool *replacep_local;
  _Bool secure_local;
  CookieInfo *ci_local;
  Cookie *co_local;
  Curl_easy *data_local;
  
  _Var1 = false;
  n = (Curl_llist_node *)0x0;
  sVar3 = cookiehash(co->domain);
  myhash = (size_t)Curl_llist_head(ci->cookielist + sVar3);
  do {
    if (myhash == 0) {
      if (n != (Curl_llist_node *)0x0) {
        co_00 = (Cookie *)Curl_node_elem(n);
        co->creationtime = co_00->creationtime;
        Curl_node_remove(n);
        freecookie(co_00);
      }
      *replacep = _Var1;
      return 0;
    }
    pvVar4 = Curl_node_elem((Curl_llist_node *)myhash);
    iVar2 = curl_strequal(*(char **)((long)pvVar4 + 0x40),co->name);
    if (iVar2 != 0) {
      bVar6 = false;
      if ((*(long *)((long)pvVar4 + 0x60) == 0) || (co->domain == (char *)0x0)) {
        if ((*(long *)((long)pvVar4 + 0x60) == 0) && (co->domain == (char *)0x0)) {
          bVar6 = true;
        }
      }
      else {
        iVar2 = curl_strequal(*(char **)((long)pvVar4 + 0x60),co->domain);
        bVar6 = iVar2 != 0;
      }
      if ((((bVar6) && (*(long *)((long)pvVar4 + 0x58) != 0)) && (co->spath != (char *)0x0)) &&
         ((((*(byte *)((long)pvVar4 + 0x74) >> 1 & 1) != 0 && (((byte)co->field_0x74 >> 1 & 1) == 0)
           ) && (!secure)))) {
        pcVar5 = strchr((char *)(*(long *)((long)pvVar4 + 0x58) + 1),0x2f);
        if (pcVar5 == (char *)0x0) {
          sep = (char *)strlen(*(char **)((long)pvVar4 + 0x58));
        }
        else {
          sep = pcVar5 + -*(long *)((long)pvVar4 + 0x58);
        }
        iVar2 = curl_strnequal(*(char **)((long)pvVar4 + 0x58),co->spath,(size_t)sep);
        if (iVar2 != 0) {
          if (((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x8ca >> 0x1c & 1) != 0)
              ) && (((data->state).feat == (curl_trc_feat *)0x0 ||
                    (0 < ((data->state).feat)->log_level)))) {
            Curl_infof(data,
                       "cookie \'%s\' for domain \'%s\' dropped, would overlay an existing cookie",
                       co->name,co->domain);
          }
          return 8;
        }
      }
    }
    if ((n == (Curl_llist_node *)0x0) &&
       (iVar2 = curl_strequal(*(char **)((long)pvVar4 + 0x40),co->name), iVar2 != 0)) {
      if ((*(long *)((long)pvVar4 + 0x60) == 0) || (co->domain == (char *)0x0)) {
        if ((*(long *)((long)pvVar4 + 0x60) == 0) && (co->domain == (char *)0x0)) {
          _Var1 = true;
        }
      }
      else {
        iVar2 = curl_strequal(*(char **)((long)pvVar4 + 0x60),co->domain);
        if ((iVar2 != 0) && ((*(byte *)((long)pvVar4 + 0x74) & 1) == (co->field_0x74 & 1))) {
          _Var1 = true;
        }
      }
      if (_Var1 != false) {
        if (((*(long *)((long)pvVar4 + 0x58) == 0) || (co->spath == (char *)0x0)) ||
           (iVar2 = curl_strequal(*(char **)((long)pvVar4 + 0x58),co->spath), iVar2 != 0)) {
          if ((*(long *)((long)pvVar4 + 0x58) == 0) != (co->spath == (char *)0x0)) {
            _Var1 = false;
          }
        }
        else {
          _Var1 = false;
        }
      }
      if (((_Var1 != false) && (((byte)co->field_0x74 >> 2 & 1) == 0)) &&
         ((*(byte *)((long)pvVar4 + 0x74) >> 2 & 1) != 0)) {
        return 0xf;
      }
      if (_Var1 != false) {
        n = (Curl_llist_node *)myhash;
      }
    }
    myhash = (size_t)Curl_node_next((Curl_llist_node *)myhash);
  } while( true );
}

Assistant:

static int
replace_existing(struct Curl_easy *data,
                 struct Cookie *co,
                 struct CookieInfo *ci,
                 bool secure,
                 bool *replacep)
{
  bool replace_old = FALSE;
  struct Curl_llist_node *replace_n = NULL;
  struct Curl_llist_node *n;
  size_t myhash = cookiehash(co->domain);
  for(n = Curl_llist_head(&ci->cookielist[myhash]); n; n = Curl_node_next(n)) {
    struct Cookie *clist = Curl_node_elem(n);
    if(strcasecompare(clist->name, co->name)) {
      /* the names are identical */
      bool matching_domains = FALSE;

      if(clist->domain && co->domain) {
        if(strcasecompare(clist->domain, co->domain))
          /* The domains are identical */
          matching_domains = TRUE;
      }
      else if(!clist->domain && !co->domain)
        matching_domains = TRUE;

      if(matching_domains && /* the domains were identical */
         clist->spath && co->spath && /* both have paths */
         clist->secure && !co->secure && !secure) {
        size_t cllen;
        const char *sep;

        /*
         * A non-secure cookie may not overlay an existing secure cookie.
         * For an existing cookie "a" with path "/login", refuse a new
         * cookie "a" with for example path "/login/en", while the path
         * "/loginhelper" is ok.
         */

        sep = strchr(clist->spath + 1, '/');

        if(sep)
          cllen = sep - clist->spath;
        else
          cllen = strlen(clist->spath);

        if(strncasecompare(clist->spath, co->spath, cllen)) {
          infof(data, "cookie '%s' for domain '%s' dropped, would "
                "overlay an existing cookie", co->name, co->domain);
          return CERR_BAD_SECURE;
        }
      }
    }

    if(!replace_n && strcasecompare(clist->name, co->name)) {
      /* the names are identical */

      if(clist->domain && co->domain) {
        if(strcasecompare(clist->domain, co->domain) &&
          (clist->tailmatch == co->tailmatch))
          /* The domains are identical */
          replace_old = TRUE;
      }
      else if(!clist->domain && !co->domain)
        replace_old = TRUE;

      if(replace_old) {
        /* the domains were identical */

        if(clist->spath && co->spath &&
           !strcasecompare(clist->spath, co->spath))
          replace_old = FALSE;
        else if(!clist->spath != !co->spath)
          replace_old = FALSE;
      }

      if(replace_old && !co->livecookie && clist->livecookie) {
        /*
         * Both cookies matched fine, except that the already present cookie
         * is "live", which means it was set from a header, while the new one
         * was read from a file and thus is not "live". "live" cookies are
         * preferred so the new cookie is freed.
         */
        return CERR_LIVE_WINS;
      }
      if(replace_old)
        replace_n = n;
    }
  }
  if(replace_n) {
    struct Cookie *repl = Curl_node_elem(replace_n);

    /* when replacing, creationtime is kept from old */
    co->creationtime = repl->creationtime;

    /* unlink the old */
    Curl_node_remove(replace_n);

    /* free the old cookie */
    freecookie(repl);
  }
  *replacep = replace_old;
  return CERR_OK;
}